

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *pptVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ThreadPool *this;
  char *__s;
  undefined1 local_138 [8];
  ThreadPool pool;
  ThreadPool *t;
  thread local_48 [2];
  int local_34;
  
  signal(0xd,(__sighandler_t)0x1);
  std::thread::hardware_concurrency();
  if (argc < 3) {
    puts("usage benmark threadCount both|server|client clientcount packetSize");
    return 0;
  }
  uVar3 = atoi(argv[1]);
  local_34 = 0;
  if ((argc != 3) && (local_34 = atoi(argv[3]), 4 < (uint)argc)) {
    packetSize = atoi(argv[4]);
  }
  printf("threadCount:%d\n",(ulong)uVar3);
  local_138[0] = (__atomic_base<bool>)false;
  hwnet::ThreadPool::TaskQueue::TaskQueue((TaskQueue *)&pool);
  pool.queue_.tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hwnet::ThreadPool::Init((ThreadPool *)local_138,1,0);
  bVar2 = hwnet::Poller::Init(&poller_,(ThreadPool *)local_138);
  if (!bVar2) {
    __s = "init failed";
    goto LAB_00111966;
  }
  if (0 < (int)uVar3) {
    do {
      this = (ThreadPool *)operator_new(0xe0);
      (this->inited)._M_base._M_i = false;
      hwnet::ThreadPool::TaskQueue::TaskQueue(&this->queue_);
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this;
      hwnet::ThreadPool::Init(this,1,1);
      if (pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<hwnet::ThreadPool*,std::allocator<hwnet::ThreadPool*>>::
        _M_realloc_insert<hwnet::ThreadPool*const&>
                  ((vector<hwnet::ThreadPool*,std::allocator<hwnet::ThreadPool*>> *)&pools,
                   (iterator)
                   pools.
                   super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (ThreadPool **)
                   &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        *pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>._M_impl
         .super__Vector_impl_data._M_finish =
             (ThreadPool *)
             pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"both","");
  pptVar1 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  iVar4 = std::__cxx11::string::compare((char *)pptVar1);
  if (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != local_48) {
    operator_delete(pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)local_48[0]._M_id._M_thread + 1);
  }
  if (iVar4 == 0) {
    server();
LAB_00111944:
    client(local_34);
  }
  else {
    pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"server","");
    iVar4 = std::__cxx11::string::compare((char *)pptVar1);
    if (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != local_48) {
      operator_delete(pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)local_48[0]._M_id._M_thread + 1);
    }
    if (iVar4 != 0) {
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"client","");
      iVar4 = std::__cxx11::string::compare((char *)pptVar1);
      if (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != local_48) {
        operator_delete(pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)local_48[0]._M_id._M_thread + 1);
      }
      if (iVar4 != 0) {
        __s = "usage benmark threadCount both|server|client clientcount packetSize";
        goto LAB_00111966;
      }
      goto LAB_00111944;
    }
    server();
  }
  hwnet::Poller::Run(&poller_);
  __s = "program end";
LAB_00111966:
  puts(__s);
  hwnet::ThreadPool::~ThreadPool((ThreadPool *)local_138);
  return 0;
}

Assistant:

int main(int argc,char **argv) {

	signal(SIGPIPE,SIG_IGN);

	auto count = 0;
	auto threadCount = std::thread::hardware_concurrency();

	auto mode = argv[2];

	if(argc < 3) {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;
	}

	threadCount = ::atoi(argv[1]);

	if(argc > 3) {
		count = ::atoi(argv[3]);
	}

	if(argc > 4) {
		packetSize = ::atoi(argv[4]);
	}

	printf("threadCount:%d\n",threadCount);
	
	ThreadPool pool;
	pool.Init(1);

	if(!poller_.Init(&pool)) {
		printf("init failed\n");
		return 0;
	}


	//每个pool只有一个线程，因此TCPSocket被绑定到单一线程上
	for(int i = 0; i < int(threadCount); i++) {
		ThreadPool *t = new ThreadPool();
		t->Init(1,ThreadPool::SwapMode);
		pools.push_back(t);
	}


	if(mode == std::string("both")) {
		server();
		client(count);
	} else if(mode == std::string("server")) {
		server();
	} else if(mode == std::string("client")) {
		client(count);
	} else {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;		
	}

	poller_.Run();

	printf("program end\n");

	return 0;
}